

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateSubFboUnbindBlitCase::preCheck
          (InvalidateSubFboUnbindBlitCase *this)

{
  int iVar1;
  RenderTarget *this_00;
  NotSupportedError *pNVar2;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  undefined1 local_45;
  allocator<char> local_31;
  string local_30;
  InvalidateSubFboUnbindBlitCase *local_10;
  InvalidateSubFboUnbindBlitCase *this_local;
  
  local_10 = this;
  this_00 = Context::getRenderTarget((this->super_FboTestCase).super_TestCase.m_context);
  iVar1 = tcu::RenderTarget::getNumSamples(this_00);
  if (0 < iVar1) {
    local_45 = 1;
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Not supported in MSAA config",&local_31);
    tcu::NotSupportedError::NotSupportedError(pNVar2,&local_30);
    local_45 = 0;
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (this->m_colorFmt == 0) {
    local_6a = 1;
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Unsupported color format",&local_69);
    tcu::NotSupportedError::NotSupportedError(pNVar2,&local_68);
    local_6a = 0;
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (this->m_depthStencilFmt == 0) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Unsupported depth/stencil format",&local_91);
    tcu::NotSupportedError::NotSupportedError(pNVar2,&local_90);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  FboTestCase::checkFormatSupport(&this->super_FboTestCase,this->m_colorFmt);
  FboTestCase::checkFormatSupport(&this->super_FboTestCase,this->m_depthStencilFmt);
  return;
}

Assistant:

void preCheck (void)
	{
		if (m_context.getRenderTarget().getNumSamples() > 0)
			throw tcu::NotSupportedError("Not supported in MSAA config");

		if (m_colorFmt == GL_NONE)
			throw tcu::NotSupportedError("Unsupported color format");

		if (m_depthStencilFmt == GL_NONE)
			throw tcu::NotSupportedError("Unsupported depth/stencil format");

		checkFormatSupport(m_colorFmt);
		checkFormatSupport(m_depthStencilFmt);
	}